

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O2

void __thiscall ncnn::Yolov3DetectionOutput::~Yolov3DetectionOutput(Yolov3DetectionOutput *this)

{
  ~Yolov3DetectionOutput(this);
  operator_delete(this,0x198);
  return;
}

Assistant:

Yolov3DetectionOutput::~Yolov3DetectionOutput()
{
    //delete softmax;
}